

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O2

void __thiscall masc::polygon::c_ply::reverse(c_ply *this)

{
  pointer pppVar1;
  int iVar2;
  undefined4 extraout_var;
  ply_vertex *this_00;
  
  this_00 = this->head;
  do {
    ply_vertex::reverse(this_00);
    iVar2 = (*this_00->_vptr_ply_vertex[3])(this_00);
    this_00 = (ply_vertex *)CONCAT44(extraout_var,iVar2);
  } while (this_00 != this->head);
  this->area = -this->area;
  pppVar1 = (this->all).
            super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->all).
      super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != pppVar1) {
    (this->all).
    super__Vector_base<masc::polygon::ply_vertex_*,_std::allocator<masc::polygon::ply_vertex_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = pppVar1;
  }
  return;
}

Assistant:

void c_ply::reverse()
{
    ply_vertex * ptr=head;
    do{
        ptr->reverse();
        ptr=ptr->getNext();
    }
    while(ptr!=head); //end while

    this->area=-this->area;
    all.clear();
}